

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void drop_item(tgestate_t *state)

{
  item_t item;
  item_t iVar1;
  attribute_t attrs;
  
  item = state->items_held[0];
  if (item != 0xff) {
    if (item == '\x06') {
      state->vischars[0].mi.sprite = sprites + 2;
    }
    iVar1 = state->items_held[1];
    state->items_held[1] = 0xff;
    state->items_held[0] = iVar1;
    draw_all_items(state);
    play_speaker(state,sound_DROP_ITEM);
    attrs = choose_game_window_attributes(state);
    set_game_window_attributes(state,attrs);
    drop_item_tail(state,item);
    return;
  }
  return;
}

Assistant:

void drop_item(tgestate_t *state)
{
  item_t      item;    /* was A */
  item_t     *itemp;   /* was HL */
  item_t      tmpitem; /* was A */
  attribute_t attrs;   /* was A */

  assert(state != NULL);

  /* Return if no items held. */
  item = state->items_held[0];
  if (item == item_NONE)
    return;

  /* When dropping the uniform reset the player sprite. */
  if (item == item_UNIFORM)
    state->vischars[0].mi.sprite = &sprites[sprite_PRISONER_FACING_AWAY_1];

  /* Shuffle items down. */
  itemp = &state->items_held[1];
  tmpitem = *itemp;
  *itemp-- = item_NONE;
  *itemp = tmpitem;

  draw_all_items(state);
  play_speaker(state, sound_DROP_ITEM);
  attrs = choose_game_window_attributes(state);
  set_game_window_attributes(state, attrs);

  drop_item_tail(state, item);
}